

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void __thiscall CVmBigNumCache::CVmBigNumCache(CVmBigNumCache *this,size_t max_regs)

{
  CVmBigNumCacheReg *pCVar1;
  CVmBigNumCacheReg *pCVar2;
  CVmBigNumCacheReg *pCVar3;
  
  pCVar1 = (CVmBigNumCacheReg *)malloc(max_regs * 0x18);
  this->reg_ = pCVar1;
  this->max_regs_ = max_regs;
  this->free_reg_ = (CVmBigNumCacheReg *)0x0;
  this->unalloc_reg_ = (CVmBigNumCacheReg *)0x0;
  if (max_regs != 0) {
    pCVar3 = (CVmBigNumCacheReg *)0x0;
    do {
      pCVar2 = pCVar1;
      pCVar2->buf_ = (char *)0x0;
      pCVar2->siz_ = 0;
      pCVar2->nxt_ = pCVar3;
      max_regs = max_regs - 1;
      pCVar1 = pCVar2 + 1;
      pCVar3 = pCVar2;
    } while (max_regs != 0);
    this->unalloc_reg_ = pCVar2;
  }
  memset(&this->ln10_,0,0x90);
  return;
}

Assistant:

CVmBigNumCache::CVmBigNumCache(size_t max_regs)
{
    CVmBigNumCacheReg *p;
    size_t i;

    /* allocate our register array */
    reg_ = (CVmBigNumCacheReg *)t3malloc(max_regs * sizeof(reg_[0]));

    /* remember the number of registers */
    max_regs_ = max_regs;

    /* clear the list heads */
    free_reg_ = 0;
    unalloc_reg_ = 0;

    /* we haven't actually allocated any registers yet - clear them out */
    for (p = reg_, i = max_regs ; i != 0 ; ++p, --i)
    {
        /* clear this register descriptor */
        p->clear();

        /* link it into the unallocated list */
        p->nxt_ = unalloc_reg_;
        unalloc_reg_ = p;
    }

    /* we haven't allocated the constants registers yet */
    ln10_.clear();
    ln2_.clear();
    pi_.clear();
    e_.clear();
    dbl_max_.clear();
    dbl_min_.clear();
}